

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_factory.h
# Opt level: O1

void ProductRegistry::AddCreator(string *type,Creator creator)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
  *this;
  const_iterator cVar1;
  ostream *poVar2;
  mapped_type *pp_Var3;
  
  this = &Registry_abi_cxx11_()->_M_t;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
          ::find(this,type);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->_M_impl).super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shoes type ",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(type->_M_dataplus)._M_p,type->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," already registered.",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
                          *)this,type);
  *pp_Var3 = creator;
  return;
}

Assistant:

static void AddCreator(const string &type, Creator creator) {
        CreatorRegistry &registry = Registry();
        if (registry.count(type) == 1) {
            cout << "Shoes type " << type << " already registered."<<endl;
        }
        registry[type] = creator;
    }